

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureDecodeEnabledCase::verifyResult
          (TextureDecodeEnabledCase *this)

{
  ulong uVar1;
  uint uVar2;
  TestLog *pTVar3;
  long lVar4;
  deUint32 dVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector<bool,_4> res_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vector<bool,_4> res;
  undefined8 local_228;
  long local_220;
  long local_218 [2];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_208;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Vec4 local_1b8;
  undefined1 local_1a8 [8];
  _func_int **pp_Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [272];
  
  pTVar3 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_208.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Vec4 *)0x0;
  local_208.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels(&this->super_SRGBTestCase,&local_208);
  tcu::linearToSRGB((tcu *)local_1a8,
                    local_208.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1c8 = (pointer)local_1a8;
  uStack_1c0 = pp_Stack_1a0;
  local_1a8 = (undefined1  [8])0x3e99999a3e4ccccd;
  pp_Stack_1a0 = (_func_int **)0x3f8000003ecccccd;
  tcu::linearToSRGB((tcu *)&local_1e8,(Vec4 *)local_1a8);
  dVar5 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  if (dVar5 == 0x8fbd) {
    uStack_1e4 = 0;
    uStack_1e0 = 0;
  }
  local_1d8 = CONCAT44(uStack_1e4,local_1e8);
  uStack_1d0 = CONCAT44(uStack_1dc,uStack_1e0);
  dVar5 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Expected color: ","");
  local_1b8.m_data[0] = 0.2;
  local_1b8.m_data._4_8_ =
       ~CONCAT44((int)((uint)(dVar5 == 0x8fbd) << 0x1f) >> 0x1f,
                 (int)((uint)(dVar5 == 0x8fbd) << 0x1f) >> 0x1f) & (ulong)DAT_01c5a6b0;
  local_1b8.m_data[3] = 1.0;
  SRGBTestCase::logColor
            ((SRGBTestCase *)((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log
             ,(string *)local_1a8,0,&local_1b8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  auVar9._0_4_ = (float)local_1c8 - (float)local_1d8;
  auVar9._4_4_ = local_1c8._4_4_ - local_1d8._4_4_;
  auVar9._8_4_ = (float)uStack_1c0 - (float)uStack_1d0;
  auVar9._12_4_ = uStack_1c0._4_4_ - uStack_1d0._4_4_;
  uVar6 = CONCAT44(auVar9._4_4_,auVar9._0_4_);
  auVar8._0_8_ = uVar6 ^ 0x8000000080000000;
  auVar8._8_4_ = -auVar9._8_4_;
  auVar8._12_4_ = -auVar9._12_4_;
  auVar9 = maxps(auVar8,auVar9);
  auVar10._4_4_ = -(uint)(auVar9._4_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[1]);
  auVar10._0_4_ = -(uint)(auVar9._0_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[0]);
  auVar10._8_4_ = -(uint)(auVar9._8_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[2]);
  auVar10._12_4_ = -(uint)(auVar9._12_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[3]);
  auVar9 = packssdw(auVar10,auVar10);
  auVar9 = packsswb(auVar9,auVar9);
  local_1a8 = (undefined1  [8])pTVar3;
  if ((byte)(auVar9[0] & DAT_01b89df0) == 0) {
LAB_0149378b:
    auVar11._4_4_ = -(uint)(local_1c8._4_4_ == local_1d8._4_4_);
    auVar11._0_4_ = -(uint)((float)local_1c8 == (float)local_1d8);
    auVar11._8_4_ = -(uint)((float)uStack_1c0 == (float)uStack_1d0);
    auVar11._12_4_ = -(uint)(uStack_1c0._4_4_ == uStack_1d0._4_4_);
    auVar9 = packssdw(auVar11,auVar11);
    auVar9 = packsswb(auVar9,auVar9);
    uVar2 = auVar9._0_4_ & (uint)DAT_01b89df0;
    local_228 = (long *)CONCAT44(local_228._4_4_,uVar2);
    if ((char)uVar2 != '\0') {
      uVar6 = 0xffffffffffffffff;
      do {
        if (uVar6 == 2) goto LAB_014937d5;
        uVar1 = uVar6 + 1;
        lVar4 = uVar6 + 2;
        uVar6 = uVar1;
      } while (*(char *)((long)&local_228 + lVar4) != '\0');
      if (2 < uVar1) goto LAB_014937d5;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a0);
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"not linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a0,(char *)local_228,local_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a0);
    std::ios_base::~ios_base(local_130);
    bVar7 = false;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 2) goto LAB_014937d5;
      uVar1 = uVar6 + 1;
      lVar4 = uVar6 + 2;
      uVar6 = uVar1;
    } while (local_1a8[lVar4] != '\0');
    if (uVar1 < 3) goto LAB_0149378b;
LAB_014937d5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a0);
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a0,(char *)local_228,local_220);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a0);
    std::ios_base::~ios_base(local_130);
    bVar7 = true;
  }
  if (local_208.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (Vec4 *)0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool TextureDecodeEnabledCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelConverted;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelConverted = tcu::linearToSRGB(pixelResultList[resultColorIdx]);
	pixelReference = this->formatReferenceColor(getColorReferenceSRGB());
	pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	// result color 0 should be SRGB. Compare with sRGB reference color
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelConverted - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelConverted, pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}